

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

size_t __thiscall ktx::ValidationContext::calcImageSize(ValidationContext *this,uint32_t level)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  optional<unsigned_char> *this_00;
  byte *pbVar6;
  byte in_SIL;
  long in_RDI;
  uchar blockSize;
  uint blockCountY;
  uint blockCountX;
  uint blockDimensionY;
  uint blockDimensionX;
  uint levelHeight;
  uint levelWidth;
  size_type in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  uint local_24 [3];
  uint local_18 [3];
  byte local_c;
  
  local_18[1] = 1;
  local_18[0] = *(uint *)(in_RDI + 0x4c) >> (in_SIL & 0x1f);
  local_c = in_SIL;
  puVar5 = std::max<unsigned_int>(local_18 + 1,local_18);
  local_18[2] = *puVar5;
  local_24[1] = 1;
  local_24[0] = *(uint *)(in_RDI + 0x50) >> (local_c & 0x1f);
  puVar5 = std::max<unsigned_int>(local_24 + 1,local_24);
  local_24[2] = *puVar5;
  this_00 = (optional<unsigned_char> *)(in_RDI + 0xc1);
  std::optional<unsigned_char>::value_or<unsigned_int>
            (this_00,(uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::optional<unsigned_char>::value_or<unsigned_char>
            (this_00,(uchar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::optional<unsigned_char>::value_or<unsigned_int>
            (this_00,(uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  std::optional<unsigned_char>::value_or<unsigned_char>
            (this_00,(uchar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  uVar3 = ceil_div<unsigned_int>(0,0x2b56b2);
  uVar4 = ceil_div<unsigned_int>(0,0x2b56c3);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::array<unsigned_char,_8UL>_> *)0x2b56d8);
  if (bVar1) {
    std::optional<std::array<unsigned_char,_8UL>_>::operator->
              ((optional<std::array<unsigned_char,_8UL>_> *)0x2b56ef);
    pbVar6 = std::array<unsigned_char,_8UL>::at
                       ((array<unsigned_char,_8UL> *)
                        CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
    bVar2 = *pbVar6;
  }
  else {
    bVar2 = std::optional<unsigned_char>::value_or<unsigned_int>
                      (this_00,(uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                      );
  }
  return (ulong)(uVar3 * uVar4 * (uint)bVar2);
}

Assistant:

size_t ValidationContext::calcImageSize(uint32_t level) {
    const auto levelWidth = std::max(1u, header.pixelWidth >> level);
    const auto levelHeight = std::max(1u, header.pixelHeight >> level);
    const auto blockDimensionX = 1u + expectedBlockDimension0.value_or(parsedBlockDimension0.value_or(0u));
    const auto blockDimensionY = 1u + expectedBlockDimension1.value_or(parsedBlockDimension1.value_or(0u));
    const auto blockCountX = ceil_div(levelWidth, blockDimensionX);
    const auto blockCountY = ceil_div(levelHeight, blockDimensionY);
    const auto blockSize = expectedBytePlanes ?
            expectedBytePlanes->at(0) :
            parsedBlockByteLength.value_or(0u);

    return blockCountX * blockCountY * blockSize;
}